

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O3

void aes_sw_setkey(ssh_cipher *ciph,void *vkey)

{
  ssh_cipher *__s;
  ushort *puVar1;
  uint *puVar2;
  byte bVar3;
  undefined1 auVar4 [14];
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  undefined1 auVar8 [14];
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 auVar15 [14];
  byte bVar16;
  undefined1 auVar17 [14];
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar20 [12];
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  ushort uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  ssh_cipher *psVar48;
  ushort uVar49;
  uint uVar50;
  ulong uVar51;
  uint uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint8_t inblk [16];
  undefined1 local_e8 [6];
  undefined1 auStack_e2 [2];
  undefined8 uStack_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ssh_cipher *local_80;
  ulong local_78;
  ulong local_70;
  ssh_cipher *local_68;
  long local_60;
  undefined1 local_58 [16];
  ssh_cipher *local_48;
  void *local_40;
  ulong local_38;
  ulong uVar36;
  
  iVar45 = ciph->vt->real_keybits;
  uVar51 = (ulong)(long)iVar45 >> 5;
  *(int *)&ciph[-0xc].vt = (iVar45 >> 5) + 6;
  uVar34 = (int)uVar51 * 4 + 0x1c;
  uVar36 = (ulong)uVar34;
  __s = ciph + -0x2a;
  local_48 = ciph;
  local_40 = vkey;
  memset(__s,0,0xf0);
  auVar28 = _DAT_00170c40;
  auVar27 = _DAT_00170c30;
  local_58 = (undefined1  [16])0x0;
  if (uVar34 != 0) {
    lVar40 = uVar51 * -2;
    uVar34 = (int)uVar51 * -4;
    uVar42 = 0xfffffffe;
    uVar44 = 0xfffffffc;
    local_cc = 0;
    iVar45 = 0;
    uVar39 = 0;
    psVar48 = __s;
    do {
      auVar54 = _local_e8;
      local_88 = uVar51;
      local_80 = __s;
      local_78 = uVar36;
      if (uVar39 < uVar51) {
        local_58._0_4_ = *(undefined4 *)((long)local_40 + uVar39 * 4);
        uVar30 = ((ulong)local_58._0_8_ >> 7 ^ local_58._0_8_) & 0xaa00aa00aa00aa;
        uVar32 = (uVar30 << 7 | uVar30) ^ local_58._0_8_;
        uVar30 = (uVar32 >> 0xe ^ uVar32) & 0xcccc0000cccc;
        uVar32 = (uVar30 << 0xe | uVar30) ^ uVar32;
        uVar31 = (ulong)((uint)uVar32 & 0xf0f0f0f0);
        uVar30 = uVar31 << 0x1c;
        uVar32 = (uVar30 | uVar31) ^ uVar32;
        uVar31 = uVar32 >> 8 & 0xff00ff00ff00ff;
        uVar33 = uVar31 << 8 ^ uVar32;
        auVar20._2_10_ = _auStack_e2;
        auVar20._0_2_ = (short)(uVar33 >> 0x10);
        _local_e8 = auVar20._0_8_ << 0x20;
        uStack_e0._2_6_ = auVar54._10_6_;
        uStack_e0._0_2_ = (short)(uVar33 >> 0x20);
        auVar57 = _local_e8;
        uStack_e0._6_2_ = auVar54._14_2_;
        _local_e8 = auVar57._0_12_;
        uStack_e0._4_2_ = (short)(uVar33 >> 0x30);
        auVar54 = _local_e8;
        local_e8._2_2_ = (short)uVar31;
        local_e8._0_2_ = (short)uVar33;
        auVar57 = _local_e8;
        uStack_e0 = auVar54._8_8_;
        local_e8 = auVar57._0_6_;
        _local_e8 = CONCAT26((short)(uVar32 >> 0x18),local_e8) & 0xffffffffffffff;
        auVar57 = _local_e8;
        uStack_e0._4_4_ = auVar54._12_4_;
        _local_e8 = auVar57._0_10_;
        uStack_e0._2_2_ = (short)(uVar31 >> 0x20);
        uStack_e0._6_1_ = (char)(uVar30 >> 0x38);
        uStack_e0._7_1_ = 0;
      }
      else {
        auVar54 = *(undefined1 (*) [16])((long)&__s->vt + (ulong)(uVar42 & 0xfffffff8) * 2);
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar54._0_10_;
        auVar4._12_2_ = auVar54._6_2_;
        auVar8._8_2_ = auVar54._4_2_;
        auVar8._0_8_ = auVar54._0_8_;
        auVar8._10_4_ = auVar4._10_4_;
        auVar17._6_8_ = 0;
        auVar17._0_6_ = auVar8._8_6_;
        auVar15._4_2_ = auVar54._2_2_;
        auVar15._0_4_ = auVar54._0_4_;
        auVar15._6_8_ = SUB148(auVar17 << 0x40,6);
        uVar30 = (ulong)(uVar44 & 0xc);
        auVar56._0_4_ = (int)(short)(auVar54._8_2_ >> uVar30);
        auVar56._4_4_ = (int)(short)(auVar54._10_2_ >> uVar30);
        auVar56._8_4_ = (int)(short)(auVar54._12_2_ >> uVar30);
        auVar56._12_4_ = (int)(short)(auVar54._14_2_ >> uVar30);
        auVar57._0_4_ = (int)(short)((auVar54._0_4_ & 0xffff) >> uVar30);
        auVar57._4_4_ = (int)(short)(auVar15._4_4_ >> uVar30);
        auVar57._8_4_ = (int)(short)(auVar8._8_4_ >> uVar30);
        auVar57._12_4_ = (int)(short)(auVar54._6_2_ >> uVar30);
        _local_e8 = packssdw(auVar57,auVar56);
        local_38 = uVar39 % uVar51;
        if (local_38 == 0) {
          auVar57 = psllw(_local_e8,3);
          auVar54._0_2_ = local_e8._0_2_ >> 1;
          auVar54._2_2_ = local_e8._2_2_ >> 1;
          auVar54._4_2_ = local_e8._4_2_ >> 1;
          auVar54._6_2_ = local_e8._6_2_ >> 1;
          auVar54._8_2_ = local_e8._8_2_ >> 1;
          auVar54._10_2_ = local_e8._10_2_ >> 1;
          auVar54._12_2_ = local_e8._12_2_ >> 1;
          auVar54._14_2_ = local_e8._14_2_ >> 1;
          _local_e8 = (auVar54 | auVar57) & auVar27;
LAB_0013ffa4:
          auVar54 = _local_e8;
          local_a0 = (uint)uStack_e0;
          uVar52 = stack0xffffffffffffff1c;
          local_8c = stack0xffffffffffffff1c ^ (uint)uStack_e0;
          uVar43 = (uint)uStack_e0._6_2_;
          local_ac = (uint)(ushort)local_e8._2_2_;
          uVar23 = local_e8._2_2_ ^ uStack_e0._6_2_;
          local_b8 = (uint)uVar23;
          local_90 = uStack_e0._6_2_ ^ (uint)uStack_e0;
          local_98 = uStack_e0._6_2_ ^ stack0xffffffffffffff1c;
          uVar49 = uStack_e0._2_2_ ^ local_e8._12_2_;
          local_a8 = local_b8 ^ local_8c;
          uVar37 = (uint)(ushort)((ushort)auStack_e2 ^ (ushort)local_a8);
          uVar52 = uVar52 ^ uVar37;
          uVar37 = uVar37 ^ uStack_e0._4_4_;
          local_9c = uVar52 ^ uVar49;
          local_d0 = uVar37 ^ local_90;
          local_94 = local_9c ^ local_d0;
          local_b4 = local_94 & local_8c ^ local_d0 & local_90;
          uVar29 = local_9c & local_98 ^ local_d0 & local_90;
          uVar47 = (uint)uVar49 ^ local_e8._0_4_;
          local_ac = local_ac ^ uVar47;
          local_a4 = local_ac ^ local_98;
          local_a0 = local_a0 ^ uVar47;
          local_d4 = uVar49 ^ local_d0;
          uVar38 = uVar37 ^ uVar52 & local_a8 ^ (uVar52 ^ local_e8._0_4_) & local_a4 ^ local_b4;
          local_b4 = local_ac & uVar47 ^ local_d4 ^ local_d4 & local_b8 ^ local_b8 ^ local_b4;
          local_b0 = uVar47 ^ uVar43;
          uVar35 = local_a0 & local_e8._0_4_ ^ local_98 ^ local_9c ^ uVar52 & local_a8 ^ uVar29;
          uVar29 = local_d4 & local_b8 ^ uVar43 ^ (local_d0 ^ local_e8._0_4_) & local_b0 ^ local_d4
                   ^ uVar29;
          uVar37 = local_b4 & uVar38;
          uVar38 = uVar38 ^ uVar35;
          uVar43 = (uVar29 ^ uVar37) & uVar38 ^ uVar35;
          uVar35 = (uVar35 ^ uVar37) & (uVar29 ^ local_b4);
          uVar50 = uVar35 ^ uVar29;
          uVar35 = (uVar35 ^ uVar37) & uVar29;
          local_b4 = local_b4 ^ uVar35;
          uVar38 = (uVar35 ^ uVar29 ^ uVar37) & uVar43 ^ uVar38;
          uVar19 = (ushort)local_b4;
          local_b4 = local_b4 ^ uVar50;
          uVar49 = (ushort)uVar38;
          uVar5 = (ushort)local_b4;
          uVar26 = uVar49 ^ uVar5;
          local_b4 = (uVar52 ^ local_e8._0_4_) & local_b4;
          uVar5 = uVar5 & (ushort)local_a4;
          uVar38 = uVar38 ^ uVar43;
          local_d4 = local_d4 & uVar38;
          uVar23 = (ushort)uVar38 & uVar23;
          uVar25 = (ushort)uVar47 & uVar49;
          local_d8 = (local_d0 ^ local_e8._0_4_) & uVar43;
          uVar6 = (ushort)(uVar43 ^ uVar50);
          uVar24 = uVar26 ^ uVar6;
          local_d0 = local_d0 & (uVar43 ^ uVar50);
          uVar22 = (ushort)local_94 & uVar24;
          uVar24 = uVar24 & (ushort)local_8c;
          uVar7 = uVar49 & (ushort)local_ac ^ (ushort)local_d8;
          local_d8 = local_d8 ^ local_e8._0_4_ & uVar50;
          uVar21 = (ushort)uVar52 & uVar19 ^ (ushort)local_d4;
          uVar49 = (ushort)local_d0 ^ (ushort)local_d4 ^ uVar22;
          uVar6 = uVar6 & (ushort)local_90 ^ uVar24;
          uVar18 = uVar23 ^ (ushort)(local_e8._0_4_ & uVar50) ^ uVar21;
          uVar41 = uVar6 ^ uVar25;
          uVar22 = (ushort)local_9c & uVar26 ^ uVar22 ^ uVar41;
          uVar41 = uVar41 ^ uVar5 ^ uVar19 & (ushort)local_a8;
          uVar25 = uVar25 ^ uVar49;
          uVar19 = (ushort)local_b4 ^ uVar41;
          uVar41 = uVar41 ^ uVar49;
          uVar21 = uVar21 ^ uVar19;
          uVar49 = (ushort)uVar43 & (ushort)local_b0 ^ uVar18 ^ uVar22;
          uStack_e0._6_2_ = uVar41;
          _local_e8 = auVar54._0_8_;
          uStack_e0._0_2_ = uVar21;
          auStack_e2 = (undefined1  [2])(uVar19 ^ (ushort)local_d8);
          local_e8._4_2_ = (ushort)uVar50 & (ushort)local_a0 ^ uVar5 ^ uVar49;
          local_e8._2_2_ = ~(uVar7 ^ uVar23 ^ uVar22);
          local_e8._0_2_ = ~(uVar18 ^ uVar7 ^ uVar6);
          uStack_e0._2_2_ = ~(uVar26 & (ushort)local_98 ^ uVar24 ^ uVar25 ^ uVar49);
          uStack_e0._4_2_ = ~(uVar25 ^ uVar21);
          local_c8 = uVar44;
          local_c4 = uVar42;
          local_c0 = iVar45;
          local_bc = uVar34;
          local_70 = uVar39;
          local_68 = psVar48;
          local_60 = lVar40;
          if (local_38 == 0) {
            if (9 < local_cc) {
              __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-sw.c"
                            ,0x2b4,
                            "void aes_sliced_key_setup(aes_sliced_key *, const void *, size_t)");
            }
            bVar3 = aes_key_setup_round_constants[local_cc];
            bVar9 = -((char)bVar3 >> 7);
            bVar10 = bVar3 >> 6;
            bVar16 = bVar3 >> 5;
            bVar11 = bVar3 >> 4;
            bVar12 = bVar3 >> 3;
            bVar13 = bVar3 >> 2;
            bVar14 = bVar3 >> 1;
            auVar53[1] = 0;
            auVar53[0] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
            auVar53[2] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
            auVar53[3] = 0;
            auVar53[4] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
            auVar53[5] = 0;
            auVar53[6] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
            auVar53[7] = 0;
            auVar53[8] = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
            auVar53[9] = 0;
            auVar53[10] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
            auVar53[0xb] = 0;
            auVar53[0xc] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
            auVar53[0xd] = 0;
            auVar53[0xe] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
            auVar53[0xf] = 0;
            _local_e8 = auVar53 & auVar28 ^ _local_e8;
            local_cc = local_cc + 1;
          }
        }
        else if (((uint)uVar39 & 7) == 4 && uVar51 == 8) goto LAB_0013ffa4;
        puVar1 = (ushort *)((long)&__s->vt + (ulong)((uint)lVar40 & 0xfffffff8) * 2);
        uVar30 = (ulong)(uVar34 & 0xc);
        local_e8._2_2_ = puVar1[1] >> uVar30 ^ local_e8._2_2_;
        local_e8._0_2_ = *puVar1 >> uVar30 ^ local_e8._0_2_;
        local_e8._4_2_ = puVar1[2] >> uVar30 ^ local_e8._4_2_;
        auStack_e2 = (undefined1  [2])(puVar1[3] >> uVar30 ^ (ushort)auStack_e2);
        uStack_e0._0_2_ = puVar1[4] >> uVar30 ^ (ushort)uStack_e0;
        uStack_e0._2_2_ = puVar1[5] >> uVar30 ^ uStack_e0._2_2_;
        uStack_e0._4_2_ = puVar1[6] >> uVar30 ^ uStack_e0._4_2_;
        uStack_e0._6_2_ = puVar1[7] >> uVar30 ^ uStack_e0._6_2_;
      }
      auVar54 = _local_e8 & auVar27;
      auVar58._0_4_ = (int)(short)(auVar54._8_2_ << iVar45);
      auVar58._4_4_ = (int)auVar54._10_2_;
      auVar58._8_4_ = (int)auVar54._12_2_;
      auVar58._12_4_ = (int)auVar54._14_2_;
      auVar55._0_4_ = (int)(short)(auVar54._0_2_ << iVar45);
      auVar55._4_4_ = (int)auVar54._2_2_;
      auVar55._8_4_ = (int)auVar54._4_2_;
      auVar55._12_4_ = (int)auVar54._6_2_;
      auVar54 = packssdw(auVar55,auVar58);
      *(undefined1 (*) [16])psVar48 = auVar54 | *(undefined1 (*) [16])psVar48;
      iVar46 = iVar45 + 4;
      iVar45 = iVar46;
      if (iVar46 == 0x10) {
        iVar45 = 0;
      }
      psVar48 = psVar48 + (ulong)(iVar46 == 0x10) * 2;
      uVar39 = uVar39 + 1;
      lVar40 = lVar40 + 2;
      uVar34 = uVar34 + 4;
      uVar42 = uVar42 + 2;
      uVar44 = uVar44 + 4;
    } while (uVar36 != uVar39);
  }
  smemclr(local_58,0x10);
  smemclr(local_e8,0x10);
  if (4 < uVar36) {
    uVar51 = 8;
    do {
      puVar2 = (uint *)((long)&local_48[-0x2a].vt + uVar51 * 2);
      *puVar2 = ~*puVar2;
      puVar2 = (uint *)((long)local_48 + uVar51 * 2 + -0x146);
      *puVar2 = ~*puVar2;
      uVar51 = uVar51 + 8;
    } while (uVar51 < uVar36 * 2);
  }
  if (uVar36 != 0) {
    uVar51 = 0;
    do {
      local_48[uVar51 - 0xa2].vt =
           (ssh_cipheralg *)
           ((ulong)*(ushort *)((long)&local_48[-0x2a].vt + uVar51 * 2) * 0x1000100010001);
      uVar51 = uVar51 + 1;
    } while (uVar36 * 2 != uVar51);
  }
  return;
}

Assistant:

static void aes_sw_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    aes_sliced_key_setup(&ctx->sk, vkey, ctx->ciph.vt->real_keybits);
}